

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationBuilder::getWeight16Before
          (CollationBuilder *this,int32_t index,int64_t node,int32_t level)

{
  UBool UVar1;
  int32_t iVar2;
  uint32_t p_00;
  uint32_t local_3c;
  uint32_t weight16;
  uint32_t p;
  uint32_t s;
  uint32_t t;
  int32_t level_local;
  int64_t node_local;
  int32_t index_local;
  CollationBuilder *this_local;
  
  iVar2 = strengthFromNode(node);
  _t = node;
  if (iVar2 == 2) {
    p = weight16FromNode(node);
  }
  else {
    p = 0x500;
  }
  while (iVar2 = strengthFromNode(_t), 1 < iVar2) {
    iVar2 = previousIndexFromNode(_t);
    _t = UVector64::elementAti(&this->nodes,iVar2);
  }
  UVar1 = isTailoredNode(_t);
  if (UVar1 == '\0') {
    iVar2 = strengthFromNode(_t);
    if (iVar2 == 1) {
      weight16 = weight16FromNode(_t);
    }
    else {
      weight16 = 0x500;
    }
    while (iVar2 = strengthFromNode(_t), 0 < iVar2) {
      iVar2 = previousIndexFromNode(_t);
      _t = UVector64::elementAti(&this->nodes,iVar2);
    }
    UVar1 = isTailoredNode(_t);
    if (UVar1 == '\0') {
      p_00 = weight32FromNode(_t);
      if (level == 1) {
        local_3c = CollationRootElements::getSecondaryBefore(&this->rootElements,p_00,weight16);
      }
      else {
        local_3c = CollationRootElements::getTertiaryBefore(&this->rootElements,p_00,weight16,p);
      }
      this_local._4_4_ = local_3c;
    }
    else {
      this_local._4_4_ = 0x100;
    }
  }
  else {
    this_local._4_4_ = 0x100;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t
CollationBuilder::getWeight16Before(int32_t index, int64_t node, int32_t level) {
    U_ASSERT(strengthFromNode(node) < level || !isTailoredNode(node));
    // Collect the root CE weights if this node is for a root CE.
    // If it is not, then return the low non-primary boundary for a tailored CE.
    uint32_t t;
    if(strengthFromNode(node) == UCOL_TERTIARY) {
        t = weight16FromNode(node);
    } else {
        t = Collation::COMMON_WEIGHT16;  // Stronger node with implied common weight.
    }
    while(strengthFromNode(node) > UCOL_SECONDARY) {
        index = previousIndexFromNode(node);
        node = nodes.elementAti(index);
    }
    if(isTailoredNode(node)) {
        return Collation::BEFORE_WEIGHT16;
    }
    uint32_t s;
    if(strengthFromNode(node) == UCOL_SECONDARY) {
        s = weight16FromNode(node);
    } else {
        s = Collation::COMMON_WEIGHT16;  // Stronger node with implied common weight.
    }
    while(strengthFromNode(node) > UCOL_PRIMARY) {
        index = previousIndexFromNode(node);
        node = nodes.elementAti(index);
    }
    if(isTailoredNode(node)) {
        return Collation::BEFORE_WEIGHT16;
    }
    // [p, s, t] is a root CE. Return the preceding weight for the requested level.
    uint32_t p = weight32FromNode(node);
    uint32_t weight16;
    if(level == UCOL_SECONDARY) {
        weight16 = rootElements.getSecondaryBefore(p, s);
    } else {
        weight16 = rootElements.getTertiaryBefore(p, s, t);
        U_ASSERT((weight16 & ~Collation::ONLY_TERTIARY_MASK) == 0);
    }
    return weight16;
}